

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

CompiledMethod *
Lodtalk::compileMethod
          (VMContext *vmContext,EvaluationScopePtr *scope,Ref<Lodtalk::ClassDescription> *clazz,
          Node *ast)

{
  int iVar1;
  undefined4 extraout_var;
  ClassDescription *this;
  Oop OVar2;
  undefined4 extraout_var_00;
  int classIndex;
  undefined1 local_140 [8];
  MethodCompiler compiler;
  undefined1 local_68 [8];
  MethodSemanticAnalysis semanticAnalyzer;
  Node *ast_local;
  Ref<Lodtalk::ClassDescription> *clazz_local;
  EvaluationScopePtr *scope_local;
  VMContext *vmContext_local;
  
  semanticAnalyzer.localContext = ast;
  MethodSemanticAnalysis::MethodSemanticAnalysis((MethodSemanticAnalysis *)local_68,vmContext,scope)
  ;
  compiler.temporalVectorCount =
       (*(semanticAnalyzer.localContext)->_vptr_Node[2])
                 (semanticAnalyzer.localContext,(MethodSemanticAnalysis *)local_68);
  compiler._188_4_ = extraout_var;
  this = Ref<Lodtalk::ClassDescription>::operator->(clazz);
  OVar2 = Behavior::getBinding(&this->super_Behavior,vmContext);
  MethodCompiler::MethodCompiler((MethodCompiler *)local_140,vmContext,OVar2);
  OVar2 = Ref<Lodtalk::ClassDescription>::getOop(clazz);
  iVar1 = classIndexOf(OVar2);
  if ((iVar1 == 0x5b) || (iVar1 == 0x5d)) {
    MethodCompiler::useLongInstanceVariableAccessors((MethodCompiler *)local_140);
  }
  iVar1 = (*(semanticAnalyzer.localContext)->_vptr_Node[2])(semanticAnalyzer.localContext,local_140)
  ;
  MethodCompiler::~MethodCompiler((MethodCompiler *)local_140);
  MethodSemanticAnalysis::~MethodSemanticAnalysis((MethodSemanticAnalysis *)local_68);
  return (CompiledMethod *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

CompiledMethod *compileMethod(VMContext *vmContext, const EvaluationScopePtr &scope, const Ref<ClassDescription> &clazz, Node *ast)
{
    // Perform the semantic analysis
    MethodSemanticAnalysis semanticAnalyzer(vmContext, scope);
    ast->acceptVisitor(&semanticAnalyzer);

    // Generate the actual method
	MethodCompiler compiler(vmContext, clazz->getBinding(vmContext));
    auto classIndex = classIndexOf(clazz.getOop());
    if (classIndex == SMCI_InstructionStream || classIndex == SMCI_Context)
        compiler.useLongInstanceVariableAccessors();

    return reinterpret_cast<CompiledMethod*> (ast->acceptVisitor(&compiler).pointer);
}